

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

word If_Dec7Perform(word *t0,int fDerive)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  long lVar14;
  undefined1 auVar13 [16];
  int Pla2Var [7];
  int Var2Pla [7];
  undefined8 local_98;
  word wStack_90;
  uint local_88 [10];
  ulong local_60;
  uint local_58 [10];
  
  local_98 = *t0;
  wStack_90 = t0[1];
  lVar3 = 0;
  do {
    local_58[lVar3] = (uint)lVar3;
    local_88[lVar3] = (uint)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  uVar8 = 0;
  do {
    uVar6 = uVar8 + 1;
    uVar5 = (ulong)uVar6;
    if (uVar8 < 6) {
      do {
        uVar2 = (uint)uVar5;
        uVar5 = (ulong)(uVar2 + 1);
        local_60 = uVar5;
        if (uVar2 < 6) {
LAB_004136ba:
          uVar9 = 0;
          If_Dec7MoveTo(&local_98,uVar8,0,(int *)local_88,(int *)local_58);
          If_Dec7MoveTo(&local_98,uVar2,1,(int *)local_88,(int *)local_58);
          uVar7 = (uint)local_60;
          If_Dec7MoveTo(&local_98,uVar7,2,(int *)local_88,(int *)local_58);
          uVar4 = 1;
          do {
            if (*(byte *)((long)&local_98 + uVar4) != (byte)local_98) {
              if ((int)uVar9 == 0) {
                uVar9 = uVar4 & 0xffffffff;
              }
              else if (*(byte *)((long)&local_98 + uVar4) !=
                       *(byte *)((long)&local_98 + (long)(int)uVar9)) goto LAB_00413745;
            }
            uVar4 = uVar4 + 1;
            if (uVar4 == 0x10) {
              if ((int)uVar9 == 0) {
                __assert_fail("iCof2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                              ,0xe3,"int If_Dec7CofCount3(word *)");
              }
              if (fDerive != 0) {
                lVar3 = 1;
                uVar6 = 0;
                uVar8 = (uint)(byte)local_98;
                do {
                  uVar7 = 1 << ((byte)lVar3 & 0x1f);
                  uVar2 = (uint)*(byte *)((long)&local_98 + lVar3);
                  if ((byte)local_98 == *(byte *)((long)&local_98 + lVar3)) {
                    uVar7 = 0;
                    uVar2 = uVar8;
                  }
                  uVar8 = uVar2;
                  uVar6 = uVar6 | uVar7;
                  lVar3 = lVar3 + 1;
                } while (lVar3 != 0x10);
                uVar5 = (ulong)(int)uVar6;
                uVar4 = 0;
                lVar10 = 0;
                lVar11 = 1;
                lVar3 = 3;
                do {
                  lVar1 = *(long *)(local_88 + lVar3);
                  auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
                  auVar12._0_8_ = lVar1;
                  auVar12._12_4_ = -(uint)(lVar1 < 0);
                  lVar14 = lVar11 * 4 + 0x10;
                  auVar13._8_4_ = (undefined4)lVar14;
                  auVar13._12_4_ = (undefined4)((ulong)lVar14 >> 0x20);
                  auVar13._0_8_ = lVar14;
                  uVar5 = uVar5 | CONCAT44(-(uint)((int)lVar1 < 0),(int)lVar1) << lVar10 * 4 + 0x10;
                  uVar4 = uVar4 | auVar12._8_8_ << auVar13._8_8_;
                  lVar10 = lVar10 + 2;
                  lVar11 = lVar11 + 2;
                  lVar3 = lVar3 + 2;
                } while (lVar3 != 7);
                return (ulong)local_88[2] << 0x38 | (ulong)local_88[1] << 0x34 |
                       (ulong)local_88[0] << 0x30 |
                       (ulong)(uVar8 << 8 | (uint)(byte)local_98) << 0x20 | 0x7000000000000000 |
                       uVar4 | uVar5;
              }
              return 1;
            }
          } while( true );
        }
LAB_00413753:
      } while (uVar2 + 1 != 7);
    }
    uVar8 = uVar6;
    if (uVar6 == 7) {
      return 0;
    }
  } while( true );
LAB_00413745:
  local_60 = (ulong)(uVar7 + 1);
  if (5 < uVar7) goto LAB_00413753;
  goto LAB_004136ba;
}

Assistant:

word If_Dec7Perform( word t0[2], int fDerive )
{
    word t[2] = {t0[0], t0[1]}; 
    int i, v, u, y, Pla2Var[7], Var2Pla[7];
    // start arrays
    for ( i = 0; i < 7; i++ )
    {
/*
        if ( i < 6 )
            assert( If_Dec6HasVar( t[0], i ) || If_Dec6HasVar( t[1], i ) );
        else
            assert( t[0] != t[1] );
*/
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    for ( v = 0;   v < 7; v++ )
    for ( u = v+1; u < 7; u++ )
    for ( y = u+1; y < 7; y++ )
    {
        If_Dec7MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, u, 1, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, y, 2, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        if ( If_Dec7CofCount3( t ) == 2 )
        {
            return !fDerive ? 1 : If_Dec7DeriveDisjoint( t, Pla2Var, Var2Pla );
        }
    }
    return 0;
}